

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle.hpp
# Opt level: O0

void __thiscall
MetaSim::Particle<JumpEvent,_AvgTimeStateStat>::clone_to
          (Particle<JumpEvent,_AvgTimeStateStat> *this,Event *e)

{
  unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_> p;
  JumpEvent *ent;
  unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
  *in_stack_ffffffffffffff98;
  AvgTimeStateStat *in_stack_ffffffffffffffa0;
  Event *this_00;
  JumpEvent *in_stack_ffffffffffffffa8;
  Particle<JumpEvent,_AvgTimeStateStat> *in_stack_ffffffffffffffb0;
  
  operator_new(0x18);
  Particle(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  this_00 = (Event *)&stack0xffffffffffffffe0;
  std::unique_ptr<MetaSim::ParticleInterface,std::default_delete<MetaSim::ParticleInterface>>::
  unique_ptr<std::default_delete<MetaSim::ParticleInterface>,void>
            ((unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
              *)this_00,(pointer)in_stack_ffffffffffffff98);
  std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>::
  unique_ptr((unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
              *)this_00,in_stack_ffffffffffffff98);
  Event::addParticle(this_00,in_stack_ffffffffffffff98);
  std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>::
  ~unique_ptr((unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
               *)this_00);
  std::unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>::
  ~unique_ptr((unique_ptr<MetaSim::ParticleInterface,_std::default_delete<MetaSim::ParticleInterface>_>
               *)this_00);
  return;
}

Assistant:

virtual void clone_to(Event &e) {
            E& ent = static_cast<E&>(e);
            std::unique_ptr< ParticleInterface > p(new Particle<E, S>(ent, *staptr_));
            ent.addParticle(std::move(p));
        }